

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_16x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 *puVar13;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar14;
  ushort uVar18;
  ushort uVar22;
  ushort uVar26;
  ushort uVar30;
  ushort uVar34;
  ushort uVar38;
  ushort uVar42;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar21 [16];
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i bottom_left;
  int val;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  byte local_b08;
  byte bStack_b07;
  byte bStack_b06;
  byte bStack_b05;
  byte bStack_b04;
  byte bStack_b03;
  byte bStack_b02;
  byte bStack_b01;
  byte local_ac8;
  byte bStack_ac7;
  byte bStack_ac6;
  byte bStack_ac5;
  byte bStack_ac4;
  byte bStack_ac3;
  byte bStack_ac2;
  byte bStack_ac1;
  ushort uStack_a26;
  ushort uStack_a24;
  ushort uStack_a22;
  ushort uStack_a1e;
  ushort uStack_a1c;
  ushort uStack_a1a;
  short local_878;
  short sStack_876;
  short sStack_874;
  short sStack_872;
  short sStack_870;
  short sStack_86e;
  short sStack_86c;
  short sStack_86a;
  ushort uStack_856;
  ushort uStack_854;
  ushort uStack_852;
  ushort uStack_84e;
  ushort uStack_84c;
  ushort uStack_84a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  ushort uStack_836;
  ushort uStack_834;
  ushort uStack_832;
  ushort uStack_82e;
  ushort uStack_82c;
  ushort uStack_82a;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  ushort uStack_696;
  ushort uStack_694;
  ushort uStack_692;
  ushort uStack_68e;
  ushort uStack_68c;
  ushort uStack_68a;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  ushort uStack_676;
  ushort uStack_674;
  ushort uStack_672;
  ushort uStack_66e;
  ushort uStack_66c;
  ushort uStack_66a;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  ushort uStack_4d6;
  ushort uStack_4d4;
  ushort uStack_4d2;
  ushort uStack_4ce;
  ushort uStack_4cc;
  ushort uStack_4ca;
  short local_4c8;
  short sStack_4c6;
  short sStack_4c4;
  short sStack_4c2;
  short sStack_4c0;
  short sStack_4be;
  short sStack_4bc;
  short sStack_4ba;
  ushort uStack_4b6;
  ushort uStack_4b4;
  ushort uStack_4b2;
  ushort uStack_4ae;
  ushort uStack_4ac;
  ushort uStack_4aa;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  ushort uStack_316;
  ushort uStack_314;
  ushort uStack_312;
  ushort uStack_30e;
  ushort uStack_30c;
  ushort uStack_30a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  ushort uStack_2f6;
  ushort uStack_2f4;
  ushort uStack_2f2;
  ushort uStack_2ee;
  ushort uStack_2ec;
  ushort uStack_2ea;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  __m128i top_hi;
  __m128i top_lo;
  __m128i top;
  __m128i round;
  __m128i scaled_bottom_left;
  
  bVar1 = *(byte *)(in_RCX + 3);
  uVar18 = CONCAT11(0,bVar1);
  uStack_a26 = (ushort)bVar1;
  uStack_a24 = (ushort)bVar1;
  uStack_a22 = (ushort)bVar1;
  uStack_a1e = (ushort)bVar1;
  uStack_a1c = (ushort)bVar1;
  uStack_a1a = (ushort)bVar1;
  sVar50 = uStack_a26 * 0x6b;
  sVar51 = uStack_a24 * 0xab;
  sVar52 = uStack_a22 * 0xc0;
  sVar53 = uVar18 * 0x100;
  sVar54 = uStack_a1e * 0x100;
  sVar55 = uStack_a1c * 0x100;
  sVar56 = uStack_a1a * 0x100;
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  local_ac8 = (byte)uVar2;
  bStack_ac7 = (byte)((ulong)uVar2 >> 8);
  bStack_ac6 = (byte)((ulong)uVar2 >> 0x10);
  bStack_ac5 = (byte)((ulong)uVar2 >> 0x18);
  bStack_ac4 = (byte)((ulong)uVar2 >> 0x20);
  bStack_ac3 = (byte)((ulong)uVar2 >> 0x28);
  bStack_ac2 = (byte)((ulong)uVar2 >> 0x30);
  bStack_ac1 = (byte)((ulong)uVar2 >> 0x38);
  local_b08 = (byte)uVar3;
  bStack_b07 = (byte)((ulong)uVar3 >> 8);
  bStack_b06 = (byte)((ulong)uVar3 >> 0x10);
  bStack_b05 = (byte)((ulong)uVar3 >> 0x18);
  bStack_b04 = (byte)((ulong)uVar3 >> 0x20);
  bStack_b03 = (byte)((ulong)uVar3 >> 0x28);
  bStack_b02 = (byte)((ulong)uVar3 >> 0x30);
  bStack_b01 = (byte)((ulong)uVar3 >> 0x38);
  auVar12._8_8_ = 0x100010001000100;
  auVar12._0_8_ = 0x100010001000100;
  auVar19 = pshufb(ZEXT716(0x400055009500ff),auVar12);
  auVar11._2_2_ = sVar50;
  auVar11._0_2_ = uVar18;
  auVar11._4_2_ = sVar51;
  auVar11._6_2_ = sVar52;
  auVar11._10_2_ = sVar54;
  auVar11._8_2_ = sVar53;
  auVar11._12_2_ = sVar55;
  auVar11._14_2_ = sVar56;
  auVar10._8_8_ = 0x100010001000100;
  auVar10._0_8_ = 0x100010001000100;
  auVar20 = pshufb(auVar11,auVar10);
  uStack_2f6 = (ushort)bStack_ac7;
  uStack_2f4 = (ushort)bStack_ac6;
  uStack_2f2 = (ushort)bStack_ac5;
  uStack_2ee = (ushort)bStack_ac3;
  uStack_2ec = (ushort)bStack_ac2;
  uStack_2ea = (ushort)bStack_ac1;
  local_308 = auVar19._0_2_;
  sStack_306 = auVar19._2_2_;
  sStack_304 = auVar19._4_2_;
  sStack_302 = auVar19._6_2_;
  sStack_300 = auVar19._8_2_;
  sStack_2fe = auVar19._10_2_;
  sStack_2fc = auVar19._12_2_;
  sStack_2fa = auVar19._14_2_;
  uStack_316 = (ushort)bStack_b07;
  uStack_314 = (ushort)bStack_b06;
  uStack_312 = (ushort)bStack_b05;
  uStack_30e = (ushort)bStack_b03;
  uStack_30c = (ushort)bStack_b02;
  uStack_30a = (ushort)bStack_b01;
  local_338 = auVar20._0_2_;
  sStack_336 = auVar20._2_2_;
  sStack_334 = auVar20._4_2_;
  sStack_332 = auVar20._6_2_;
  sStack_330 = auVar20._8_2_;
  sStack_32e = auVar20._10_2_;
  sStack_32c = auVar20._12_2_;
  sStack_32a = auVar20._14_2_;
  uVar14 = local_338 + (ushort)local_ac8 * local_308 + 0x80;
  uVar22 = sStack_336 + uStack_2f6 * sStack_306 + 0x80;
  uVar26 = sStack_334 + uStack_2f4 * sStack_304 + 0x80;
  uVar30 = sStack_332 + uStack_2f2 * sStack_302 + 0x80;
  uVar34 = sStack_330 + (ushort)bStack_ac4 * sStack_300 + 0x80;
  uVar38 = sStack_32e + uStack_2ee * sStack_2fe + 0x80;
  uVar42 = sStack_32c + uStack_2ec * sStack_2fc + 0x80;
  uVar46 = sStack_32a + uStack_2ea * sStack_2fa + 0x80;
  uVar15 = uVar14 >> 8;
  uVar23 = uVar22 >> 8;
  uVar27 = uVar26 >> 8;
  uVar31 = uVar30 >> 8;
  uVar35 = uVar34 >> 8;
  uVar39 = uVar38 >> 8;
  uVar43 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar16 = local_338 + (ushort)local_b08 * local_308 + 0x80;
  uVar24 = sStack_336 + uStack_316 * sStack_306 + 0x80;
  uVar28 = sStack_334 + uStack_314 * sStack_304 + 0x80;
  uVar32 = sStack_332 + uStack_312 * sStack_302 + 0x80;
  uVar36 = sStack_330 + (ushort)bStack_b04 * sStack_300 + 0x80;
  uVar40 = sStack_32e + uStack_30e * sStack_2fe + 0x80;
  uVar44 = sStack_32c + uStack_30c * sStack_2fc + 0x80;
  uVar48 = sStack_32a + uStack_30a * sStack_2fa + 0x80;
  uVar17 = uVar16 >> 8;
  uVar25 = uVar24 >> 8;
  uVar29 = uVar28 >> 8;
  uVar33 = uVar32 >> 8;
  uVar37 = uVar36 >> 8;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  *in_RDI = CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                     CONCAT16((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                              (0xff < uVar43),
                              CONCAT15((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                       (0xff < uVar39),
                                       CONCAT14((uVar35 != 0) * (uVar35 < 0x100) *
                                                (char)(uVar34 >> 8) - (0xff < uVar35),
                                                CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                         (char)(uVar30 >> 8) - (0xff < uVar31),
                                                         CONCAT12((uVar27 != 0) * (uVar27 < 0x100) *
                                                                  (char)(uVar26 >> 8) -
                                                                  (0xff < uVar27),
                                                                  CONCAT11((uVar23 != 0) *
                                                                           (uVar23 < 0x100) *
                                                                           (char)(uVar22 >> 8) -
                                                                           (0xff < uVar23),
                                                                           (uVar15 != 0) *
                                                                           (uVar15 < 0x100) *
                                                                           (char)(uVar14 >> 8) -
                                                                           (0xff < uVar15))))))));
  in_RDI[1] = CONCAT17((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49),
                       CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) -
                                (0xff < uVar45),
                                CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                         (0xff < uVar41),
                                         CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                  (char)(uVar36 >> 8) - (0xff < uVar37),
                                                  CONCAT13((uVar33 != 0) * (uVar33 < 0x100) *
                                                           (char)(uVar32 >> 8) - (0xff < uVar33),
                                                           CONCAT12((uVar29 != 0) * (uVar29 < 0x100)
                                                                    * (char)(uVar28 >> 8) -
                                                                    (0xff < uVar29),
                                                                    CONCAT11((uVar25 != 0) *
                                                                             (uVar25 < 0x100) *
                                                                             (char)(uVar24 >> 8) -
                                                                             (0xff < uVar25),
                                                                             (uVar17 != 0) *
                                                                             (uVar17 < 0x100) *
                                                                             (char)(uVar16 >> 8) -
                                                                             (0xff < uVar17))))))));
  puVar13 = (undefined8 *)((long)in_RDI + in_RSI);
  auVar9._8_8_ = 0x302030203020302;
  auVar9._0_8_ = 0x302030203020302;
  auVar19 = pshufb(ZEXT716(0x400055009500ff),auVar9);
  auVar8._2_2_ = sVar50;
  auVar8._0_2_ = uVar18;
  auVar8._4_2_ = sVar51;
  auVar8._6_2_ = sVar52;
  auVar8._10_2_ = sVar54;
  auVar8._8_2_ = sVar53;
  auVar8._12_2_ = sVar55;
  auVar8._14_2_ = sVar56;
  auVar7._8_8_ = 0x302030203020302;
  auVar7._0_8_ = 0x302030203020302;
  auVar20 = pshufb(auVar8,auVar7);
  uStack_4b6 = (ushort)bStack_ac7;
  uStack_4b4 = (ushort)bStack_ac6;
  uStack_4b2 = (ushort)bStack_ac5;
  uStack_4ae = (ushort)bStack_ac3;
  uStack_4ac = (ushort)bStack_ac2;
  uStack_4aa = (ushort)bStack_ac1;
  local_4c8 = auVar19._0_2_;
  sStack_4c6 = auVar19._2_2_;
  sStack_4c4 = auVar19._4_2_;
  sStack_4c2 = auVar19._6_2_;
  sStack_4c0 = auVar19._8_2_;
  sStack_4be = auVar19._10_2_;
  sStack_4bc = auVar19._12_2_;
  sStack_4ba = auVar19._14_2_;
  uStack_4d6 = (ushort)bStack_b07;
  uStack_4d4 = (ushort)bStack_b06;
  uStack_4d2 = (ushort)bStack_b05;
  uStack_4ce = (ushort)bStack_b03;
  uStack_4cc = (ushort)bStack_b02;
  uStack_4ca = (ushort)bStack_b01;
  local_4f8 = auVar20._0_2_;
  sStack_4f6 = auVar20._2_2_;
  sStack_4f4 = auVar20._4_2_;
  sStack_4f2 = auVar20._6_2_;
  sStack_4f0 = auVar20._8_2_;
  sStack_4ee = auVar20._10_2_;
  sStack_4ec = auVar20._12_2_;
  sStack_4ea = auVar20._14_2_;
  uVar14 = local_4f8 + (ushort)local_ac8 * local_4c8 + 0x80;
  uVar22 = sStack_4f6 + uStack_4b6 * sStack_4c6 + 0x80;
  uVar26 = sStack_4f4 + uStack_4b4 * sStack_4c4 + 0x80;
  uVar30 = sStack_4f2 + uStack_4b2 * sStack_4c2 + 0x80;
  uVar34 = sStack_4f0 + (ushort)bStack_ac4 * sStack_4c0 + 0x80;
  uVar38 = sStack_4ee + uStack_4ae * sStack_4be + 0x80;
  uVar42 = sStack_4ec + uStack_4ac * sStack_4bc + 0x80;
  uVar46 = sStack_4ea + uStack_4aa * sStack_4ba + 0x80;
  uVar15 = uVar14 >> 8;
  uVar23 = uVar22 >> 8;
  uVar27 = uVar26 >> 8;
  uVar31 = uVar30 >> 8;
  uVar35 = uVar34 >> 8;
  uVar39 = uVar38 >> 8;
  uVar43 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar16 = local_4f8 + (ushort)local_b08 * local_4c8 + 0x80;
  uVar24 = sStack_4f6 + uStack_4d6 * sStack_4c6 + 0x80;
  uVar28 = sStack_4f4 + uStack_4d4 * sStack_4c4 + 0x80;
  uVar32 = sStack_4f2 + uStack_4d2 * sStack_4c2 + 0x80;
  uVar36 = sStack_4f0 + (ushort)bStack_b04 * sStack_4c0 + 0x80;
  uVar40 = sStack_4ee + uStack_4ce * sStack_4be + 0x80;
  uVar44 = sStack_4ec + uStack_4cc * sStack_4bc + 0x80;
  uVar48 = sStack_4ea + uStack_4ca * sStack_4ba + 0x80;
  uVar17 = uVar16 >> 8;
  uVar25 = uVar24 >> 8;
  uVar29 = uVar28 >> 8;
  uVar33 = uVar32 >> 8;
  uVar37 = uVar36 >> 8;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  *puVar13 = CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                      CONCAT16((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                               (0xff < uVar43),
                               CONCAT15((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                        (0xff < uVar39),
                                        CONCAT14((uVar35 != 0) * (uVar35 < 0x100) *
                                                 (char)(uVar34 >> 8) - (0xff < uVar35),
                                                 CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                          (char)(uVar30 >> 8) - (0xff < uVar31),
                                                          CONCAT12((uVar27 != 0) * (uVar27 < 0x100)
                                                                   * (char)(uVar26 >> 8) -
                                                                   (0xff < uVar27),
                                                                   CONCAT11((uVar23 != 0) *
                                                                            (uVar23 < 0x100) *
                                                                            (char)(uVar22 >> 8) -
                                                                            (0xff < uVar23),
                                                                            (uVar15 != 0) *
                                                                            (uVar15 < 0x100) *
                                                                            (char)(uVar14 >> 8) -
                                                                            (0xff < uVar15))))))));
  puVar13[1] = CONCAT17((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49),
                        CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) -
                                 (0xff < uVar45),
                                 CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                          (0xff < uVar41),
                                          CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                   (char)(uVar36 >> 8) - (0xff < uVar37),
                                                   CONCAT13((uVar33 != 0) * (uVar33 < 0x100) *
                                                            (char)(uVar32 >> 8) - (0xff < uVar33),
                                                            CONCAT12((uVar29 != 0) *
                                                                     (uVar29 < 0x100) *
                                                                     (char)(uVar28 >> 8) -
                                                                     (0xff < uVar29),
                                                                     CONCAT11((uVar25 != 0) *
                                                                              (uVar25 < 0x100) *
                                                                              (char)(uVar24 >> 8) -
                                                                              (0xff < uVar25),
                                                                              (uVar17 != 0) *
                                                                              (uVar17 < 0x100) *
                                                                              (char)(uVar16 >> 8) -
                                                                              (0xff < uVar17))))))))
  ;
  puVar13 = (undefined8 *)((long)puVar13 + in_RSI);
  auVar6._8_8_ = 0x504050405040504;
  auVar6._0_8_ = 0x504050405040504;
  auVar19 = pshufb(ZEXT716(0x400055009500ff),auVar6);
  auVar5._2_2_ = sVar50;
  auVar5._0_2_ = uVar18;
  auVar5._4_2_ = sVar51;
  auVar5._6_2_ = sVar52;
  auVar5._10_2_ = sVar54;
  auVar5._8_2_ = sVar53;
  auVar5._12_2_ = sVar55;
  auVar5._14_2_ = sVar56;
  auVar4._8_8_ = 0x504050405040504;
  auVar4._0_8_ = 0x504050405040504;
  auVar20 = pshufb(auVar5,auVar4);
  uStack_676 = (ushort)bStack_ac7;
  uStack_674 = (ushort)bStack_ac6;
  uStack_672 = (ushort)bStack_ac5;
  uStack_66e = (ushort)bStack_ac3;
  uStack_66c = (ushort)bStack_ac2;
  uStack_66a = (ushort)bStack_ac1;
  local_688 = auVar19._0_2_;
  sStack_686 = auVar19._2_2_;
  sStack_684 = auVar19._4_2_;
  sStack_682 = auVar19._6_2_;
  sStack_680 = auVar19._8_2_;
  sStack_67e = auVar19._10_2_;
  sStack_67c = auVar19._12_2_;
  sStack_67a = auVar19._14_2_;
  uStack_696 = (ushort)bStack_b07;
  uStack_694 = (ushort)bStack_b06;
  uStack_692 = (ushort)bStack_b05;
  uStack_68e = (ushort)bStack_b03;
  uStack_68c = (ushort)bStack_b02;
  uStack_68a = (ushort)bStack_b01;
  local_6b8 = auVar20._0_2_;
  sStack_6b6 = auVar20._2_2_;
  sStack_6b4 = auVar20._4_2_;
  sStack_6b2 = auVar20._6_2_;
  sStack_6b0 = auVar20._8_2_;
  sStack_6ae = auVar20._10_2_;
  sStack_6ac = auVar20._12_2_;
  sStack_6aa = auVar20._14_2_;
  uVar14 = local_6b8 + (ushort)local_ac8 * local_688 + 0x80;
  uVar22 = sStack_6b6 + uStack_676 * sStack_686 + 0x80;
  uVar26 = sStack_6b4 + uStack_674 * sStack_684 + 0x80;
  uVar30 = sStack_6b2 + uStack_672 * sStack_682 + 0x80;
  uVar34 = sStack_6b0 + (ushort)bStack_ac4 * sStack_680 + 0x80;
  uVar38 = sStack_6ae + uStack_66e * sStack_67e + 0x80;
  uVar42 = sStack_6ac + uStack_66c * sStack_67c + 0x80;
  uVar46 = sStack_6aa + uStack_66a * sStack_67a + 0x80;
  uVar15 = uVar14 >> 8;
  uVar23 = uVar22 >> 8;
  uVar27 = uVar26 >> 8;
  uVar31 = uVar30 >> 8;
  uVar35 = uVar34 >> 8;
  uVar39 = uVar38 >> 8;
  uVar43 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar16 = local_6b8 + (ushort)local_b08 * local_688 + 0x80;
  uVar24 = sStack_6b6 + uStack_696 * sStack_686 + 0x80;
  uVar28 = sStack_6b4 + uStack_694 * sStack_684 + 0x80;
  uVar32 = sStack_6b2 + uStack_692 * sStack_682 + 0x80;
  uVar36 = sStack_6b0 + (ushort)bStack_b04 * sStack_680 + 0x80;
  uVar40 = sStack_6ae + uStack_68e * sStack_67e + 0x80;
  uVar44 = sStack_6ac + uStack_68c * sStack_67c + 0x80;
  uVar48 = sStack_6aa + uStack_68a * sStack_67a + 0x80;
  uVar17 = uVar16 >> 8;
  uVar25 = uVar24 >> 8;
  uVar29 = uVar28 >> 8;
  uVar33 = uVar32 >> 8;
  uVar37 = uVar36 >> 8;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  *puVar13 = CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                      CONCAT16((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                               (0xff < uVar43),
                               CONCAT15((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) -
                                        (0xff < uVar39),
                                        CONCAT14((uVar35 != 0) * (uVar35 < 0x100) *
                                                 (char)(uVar34 >> 8) - (0xff < uVar35),
                                                 CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                          (char)(uVar30 >> 8) - (0xff < uVar31),
                                                          CONCAT12((uVar27 != 0) * (uVar27 < 0x100)
                                                                   * (char)(uVar26 >> 8) -
                                                                   (0xff < uVar27),
                                                                   CONCAT11((uVar23 != 0) *
                                                                            (uVar23 < 0x100) *
                                                                            (char)(uVar22 >> 8) -
                                                                            (0xff < uVar23),
                                                                            (uVar15 != 0) *
                                                                            (uVar15 < 0x100) *
                                                                            (char)(uVar14 >> 8) -
                                                                            (0xff < uVar15))))))));
  puVar13[1] = CONCAT17((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49),
                        CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) -
                                 (0xff < uVar45),
                                 CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                          (0xff < uVar41),
                                          CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                   (char)(uVar36 >> 8) - (0xff < uVar37),
                                                   CONCAT13((uVar33 != 0) * (uVar33 < 0x100) *
                                                            (char)(uVar32 >> 8) - (0xff < uVar33),
                                                            CONCAT12((uVar29 != 0) *
                                                                     (uVar29 < 0x100) *
                                                                     (char)(uVar28 >> 8) -
                                                                     (0xff < uVar29),
                                                                     CONCAT11((uVar25 != 0) *
                                                                              (uVar25 < 0x100) *
                                                                              (char)(uVar24 >> 8) -
                                                                              (0xff < uVar25),
                                                                              (uVar17 != 0) *
                                                                              (uVar17 < 0x100) *
                                                                              (char)(uVar16 >> 8) -
                                                                              (0xff < uVar17))))))))
  ;
  auVar21._8_8_ = 0x706070607060706;
  auVar21._0_8_ = 0x706070607060706;
  auVar21 = pshufb(ZEXT716(0x400055009500ff),auVar21);
  auVar20._2_2_ = sVar50;
  auVar20._0_2_ = uVar18;
  auVar20._4_2_ = sVar51;
  auVar20._6_2_ = sVar52;
  auVar20._10_2_ = sVar54;
  auVar20._8_2_ = sVar53;
  auVar20._12_2_ = sVar55;
  auVar20._14_2_ = sVar56;
  auVar19._8_8_ = 0x706070607060706;
  auVar19._0_8_ = 0x706070607060706;
  auVar19 = pshufb(auVar20,auVar19);
  uStack_836 = (ushort)bStack_ac7;
  uStack_834 = (ushort)bStack_ac6;
  uStack_832 = (ushort)bStack_ac5;
  uStack_82e = (ushort)bStack_ac3;
  uStack_82c = (ushort)bStack_ac2;
  uStack_82a = (ushort)bStack_ac1;
  local_848 = auVar21._0_2_;
  sStack_846 = auVar21._2_2_;
  sStack_844 = auVar21._4_2_;
  sStack_842 = auVar21._6_2_;
  sStack_840 = auVar21._8_2_;
  sStack_83e = auVar21._10_2_;
  sStack_83c = auVar21._12_2_;
  sStack_83a = auVar21._14_2_;
  uStack_856 = (ushort)bStack_b07;
  uStack_854 = (ushort)bStack_b06;
  uStack_852 = (ushort)bStack_b05;
  uStack_84e = (ushort)bStack_b03;
  uStack_84c = (ushort)bStack_b02;
  uStack_84a = (ushort)bStack_b01;
  local_878 = auVar19._0_2_;
  sStack_876 = auVar19._2_2_;
  sStack_874 = auVar19._4_2_;
  sStack_872 = auVar19._6_2_;
  sStack_870 = auVar19._8_2_;
  sStack_86e = auVar19._10_2_;
  sStack_86c = auVar19._12_2_;
  sStack_86a = auVar19._14_2_;
  uVar18 = local_878 + (ushort)local_ac8 * local_848 + 0x80;
  uVar17 = sStack_876 + uStack_836 * sStack_846 + 0x80;
  uVar25 = sStack_874 + uStack_834 * sStack_844 + 0x80;
  uVar29 = sStack_872 + uStack_832 * sStack_842 + 0x80;
  uVar33 = sStack_870 + (ushort)bStack_ac4 * sStack_840 + 0x80;
  uVar37 = sStack_86e + uStack_82e * sStack_83e + 0x80;
  uVar41 = sStack_86c + uStack_82c * sStack_83c + 0x80;
  uVar45 = sStack_86a + uStack_82a * sStack_83a + 0x80;
  uVar14 = uVar18 >> 8;
  uVar22 = uVar17 >> 8;
  uVar26 = uVar25 >> 8;
  uVar30 = uVar29 >> 8;
  uVar34 = uVar33 >> 8;
  uVar38 = uVar37 >> 8;
  uVar42 = uVar41 >> 8;
  uVar46 = uVar45 >> 8;
  uVar15 = local_878 + (ushort)local_b08 * local_848 + 0x80;
  uVar23 = sStack_876 + uStack_856 * sStack_846 + 0x80;
  uVar27 = sStack_874 + uStack_854 * sStack_844 + 0x80;
  uVar31 = sStack_872 + uStack_852 * sStack_842 + 0x80;
  uVar35 = sStack_870 + (ushort)bStack_b04 * sStack_840 + 0x80;
  uVar39 = sStack_86e + uStack_84e * sStack_83e + 0x80;
  uVar43 = sStack_86c + uStack_84c * sStack_83c + 0x80;
  uVar47 = sStack_86a + uStack_84a * sStack_83a + 0x80;
  uVar16 = uVar15 >> 8;
  uVar24 = uVar23 >> 8;
  uVar28 = uVar27 >> 8;
  uVar32 = uVar31 >> 8;
  uVar36 = uVar35 >> 8;
  uVar40 = uVar39 >> 8;
  uVar44 = uVar43 >> 8;
  uVar48 = uVar47 >> 8;
  *(undefined8 *)((long)puVar13 + in_RSI) =
       CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                         CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                  (0xff < uVar38),
                                  CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) -
                                           (0xff < uVar34),
                                           CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                    (char)(uVar29 >> 8) - (0xff < uVar30),
                                                    CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                             (char)(uVar25 >> 8) - (0xff < uVar26),
                                                             CONCAT11((uVar22 != 0) *
                                                                      (uVar22 < 0x100) *
                                                                      (char)(uVar17 >> 8) -
                                                                      (0xff < uVar22),
                                                                      (uVar14 != 0) *
                                                                      (uVar14 < 0x100) *
                                                                      (char)(uVar18 >> 8) -
                                                                      (0xff < uVar14))))))));
  ((undefined8 *)((long)puVar13 + in_RSI))[1] =
       CONCAT17((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                CONCAT16((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                         CONCAT15((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                  (0xff < uVar40),
                                  CONCAT14((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                           (0xff < uVar36),
                                           CONCAT13((uVar32 != 0) * (uVar32 < 0x100) *
                                                    (char)(uVar31 >> 8) - (0xff < uVar32),
                                                    CONCAT12((uVar28 != 0) * (uVar28 < 0x100) *
                                                             (char)(uVar27 >> 8) - (0xff < uVar28),
                                                             CONCAT11((uVar24 != 0) *
                                                                      (uVar24 < 0x100) *
                                                                      (char)(uVar23 >> 8) -
                                                                      (0xff < uVar24),
                                                                      (uVar16 != 0) *
                                                                      (uVar16 < 0x100) *
                                                                      (char)(uVar15 >> 8) -
                                                                      (0xff < uVar16))))))));
  return;
}

Assistant:

void aom_smooth_v_predictor_16x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = cvtepu8_epi16(_mm_srli_si128(top, 8));

  __m128i y_select = _mm_set1_epi32(0x01000100);
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
}